

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uciengine.cpp
# Opt level: O3

string * __thiscall
banksia::UciEngine::getPositionString_abi_cxx11_
          (string *__return_storage_ptr__,UciEngine *this,Move *pondermove)

{
  ChessBoard *pCVar1;
  pointer pHVar2;
  long lVar3;
  bool bVar4;
  long *plVar5;
  undefined8 *puVar6;
  long *plVar7;
  size_type *psVar8;
  pointer this_00;
  long *local_a8;
  long local_a0;
  long local_98;
  long lStack_90;
  UciEngine *local_88;
  Move *local_80;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_78;
  string local_70;
  string local_50;
  
  local_80 = pondermove;
  bVar4 = BoardCore::fromOriginPosition
                    (&((this->super_EngineProfile).super_Engine.super_Player.board)->super_BoardCore
                    );
  if (bVar4) {
    local_a8 = &local_98;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"startpos","");
  }
  else {
    BoardCore::getStartingFen_abi_cxx11_
              (&local_50,
               &((this->super_EngineProfile).super_Engine.super_Player.board)->super_BoardCore);
    plVar5 = (long *)std::__cxx11::string::replace((ulong)&local_50,0,(char *)0x0,0x18a54e);
    local_a8 = &local_98;
    plVar7 = plVar5 + 2;
    if ((long *)*plVar5 == plVar7) {
      local_98 = *plVar7;
      lStack_90 = plVar5[3];
    }
    else {
      local_98 = *plVar7;
      local_a8 = (long *)*plVar5;
    }
    local_a0 = plVar5[1];
    *plVar5 = (long)plVar7;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
  }
  plVar5 = (long *)std::__cxx11::string::replace((ulong)&local_a8,0,(char *)0x0,0x18a53b);
  local_78 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_78;
  psVar8 = (size_type *)(plVar5 + 2);
  if ((size_type *)*plVar5 == psVar8) {
    lVar3 = plVar5[3];
    local_78->_M_allocated_capacity = *psVar8;
    *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar3;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar5;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar8;
  }
  __return_storage_ptr__->_M_string_length = plVar5[1];
  *plVar5 = (long)psVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  if (local_a8 != &local_98) {
    operator_delete(local_a8);
  }
  if ((!bVar4) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2)) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  pCVar1 = (this->super_EngineProfile).super_Engine.super_Player.board;
  local_88 = this;
  if ((pCVar1->super_BoardCore).histList.
      super__Vector_base<banksia::Hist,_std::allocator<banksia::Hist>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (pCVar1->super_BoardCore).histList.
      super__Vector_base<banksia::Hist,_std::allocator<banksia::Hist>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    pCVar1 = (local_88->super_EngineProfile).super_Engine.super_Player.board;
    this_00 = (pCVar1->super_BoardCore).histList.
              super__Vector_base<banksia::Hist,_std::allocator<banksia::Hist>_>._M_impl.
              super__Vector_impl_data._M_start;
    pHVar2 = (pCVar1->super_BoardCore).histList.
             super__Vector_base<banksia::Hist,_std::allocator<banksia::Hist>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (this_00 != pHVar2) {
      do {
        Move::toCoordinateString_abi_cxx11_(&local_70,(Move *)this_00);
        puVar6 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_70,0,(char *)0x0,0x18a12f);
        plVar5 = puVar6 + 2;
        if ((long *)*puVar6 == plVar5) {
          local_98 = *plVar5;
          lStack_90 = puVar6[3];
          local_a8 = &local_98;
        }
        else {
          local_98 = *plVar5;
          local_a8 = (long *)*puVar6;
        }
        local_a0 = puVar6[1];
        *puVar6 = plVar5;
        puVar6[1] = 0;
        *(undefined1 *)(puVar6 + 2) = 0;
        std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_a8);
        if (local_a8 != &local_98) {
          operator_delete(local_a8);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != &local_70.field_2) {
          operator_delete(local_70._M_dataplus._M_p);
        }
        this_00 = this_00 + 1;
      } while (this_00 != pHVar2);
    }
  }
  if ((uint)(local_80->dest | local_80->from) < 0x40 && local_80->from != local_80->dest) {
    pCVar1 = (local_88->super_EngineProfile).super_Engine.super_Player.board;
    if ((pCVar1->super_BoardCore).histList.
        super__Vector_base<banksia::Hist,_std::allocator<banksia::Hist>_>._M_impl.
        super__Vector_impl_data._M_start ==
        (pCVar1->super_BoardCore).histList.
        super__Vector_base<banksia::Hist,_std::allocator<banksia::Hist>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
    Move::toCoordinateString_abi_cxx11_(&local_70,local_80);
    puVar6 = (undefined8 *)std::__cxx11::string::replace((ulong)&local_70,0,(char *)0x0,0x18a12f);
    plVar5 = puVar6 + 2;
    if ((long *)*puVar6 == plVar5) {
      local_98 = *plVar5;
      lStack_90 = puVar6[3];
      local_a8 = &local_98;
    }
    else {
      local_98 = *plVar5;
      local_a8 = (long *)*puVar6;
    }
    local_a0 = puVar6[1];
    *puVar6 = plVar5;
    puVar6[1] = 0;
    *(undefined1 *)(puVar6 + 2) = 0;
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_a8);
    if (local_a8 != &local_98) {
      operator_delete(local_a8);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string UciEngine::getPositionString(const Move& pondermove) const
{
    assert(board);
    
    std::string str = "position " + (board->fromOriginPosition() ? "startpos" : ("fen " + board->getStartingFen()));
    
    if (!board->histList.empty()) {
        str += " moves";
        for(auto && hist : board->histList) {
            str += " " + hist.move.toCoordinateString();
        }
    }
    
    if (pondermove.isValid()) {
        if (board->histList.empty()) {
            str += " moves";
        }
        str += " " + pondermove.toCoordinateString();
    }
    return str;
}